

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_address.c
# Opt level: O2

LY_ERR lyplg_type_store_ipv6_address
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  char **str_p;
  lysc_range *range;
  undefined8 uVar1;
  LY_ERR LVar2;
  int iVar3;
  ushort **ppuVar4;
  char *__cp;
  lyd_value *str_p_00;
  size_t sVar5;
  char *pcVar6;
  undefined8 in_stack_ffffffffffffff98;
  char *local_50;
  
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    if (value_len < 0x10) {
      pcVar6 = "Invalid LYB ipv6-address value size %zu (expected at least 16).";
    }
    else {
      sVar5 = 0x10;
      do {
        if (value_len == sVar5) {
          uVar1 = *(undefined8 *)((long)value + 8);
          (storage->field_2).dec64 = *value;
          *(undefined8 *)((long)&storage->field_2 + 8) = uVar1;
          if (value_len != 0x10) {
            value_len = value_len - 0x10;
            str_p_00 = (lyd_value *)((long)&storage->field_2 + 0x10);
            pcVar6 = (char *)((long)value + 0x10);
            goto LAB_001b1e1d;
          }
          *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
          LVar2 = LY_SUCCESS;
          goto LAB_001b1cde;
        }
        ppuVar4 = __ctype_b_loc();
        pcVar6 = (char *)((long)value + sVar5);
        sVar5 = sVar5 + 1;
      } while (((*ppuVar4)[*pcVar6] & 8) != 0);
      value_len = CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)*pcVar6);
      pcVar6 = "Invalid LYB ipv6-address zone character 0x%x.";
    }
    LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,pcVar6,value_len);
  }
  else {
    LVar2 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar2 == LY_SUCCESS) {
      if ((options & 8) == 0) {
        range = (lysc_range *)type[1].name;
        if (range != (lysc_range *)0x0) {
          sVar5 = ly_utf8len((char *)value,value_len);
          LVar2 = lyplg_type_validate_range(LY_TYPE_STRING,range,sVar5,(char *)value,value_len,err);
          if (LVar2 != LY_SUCCESS) goto LAB_001b1cde;
        }
        LVar2 = lyplg_type_validate_patterns
                          ((lysc_pattern **)type[1].exts,(char *)value,value_len,err);
        if (LVar2 != LY_SUCCESS) goto LAB_001b1cde;
      }
      str_p = (char **)((long)&storage->field_2 + 0x10);
      pcVar6 = ly_strnchr((char *)value,0x25,value_len);
      if (pcVar6 == (char *)0x0) {
        *str_p = (char *)0x0;
        if ((options & 1) == 0) {
          __cp = strndup((char *)value,value_len);
          local_50 = __cp;
        }
        else {
LAB_001b1d89:
          local_50 = (char *)0x0;
          __cp = (char *)value;
        }
LAB_001b1d95:
        iVar3 = inet_pton(10,__cp,&storage->field_2);
        if (iVar3 == 0) {
          LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                             "Failed to convert IPv6 address \"%s\".",__cp);
        }
        else {
          LVar2 = LY_SUCCESS;
          if ((options & 1) != 0 && pcVar6 != (char *)0x0) {
            *pcVar6 = '%';
          }
        }
      }
      else {
        LVar2 = lydict_insert(ctx,pcVar6 + 1,~((long)pcVar6 - (long)value) + value_len,str_p);
        if (LVar2 == LY_SUCCESS) {
          if ((options & 1) != 0) {
            *pcVar6 = '\0';
            goto LAB_001b1d89;
          }
          __cp = strndup((char *)value,(long)pcVar6 - (long)value);
          local_50 = __cp;
          goto LAB_001b1d95;
        }
        local_50 = (char *)0x0;
      }
      free(local_50);
      if (format == LY_VALUE_CANON && LVar2 == LY_SUCCESS) {
        if ((options & 1) != 0) {
          LVar2 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
          goto LAB_001b1ced;
        }
        str_p_00 = storage;
        pcVar6 = "";
        if (value_len != 0) {
          pcVar6 = (char *)value;
        }
LAB_001b1e1d:
        LVar2 = lydict_insert(ctx,pcVar6,value_len,&str_p_00->_canonical);
      }
    }
  }
LAB_001b1cde:
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001b1ced:
  if (LVar2 != LY_SUCCESS) {
    lyplg_type_free_ipv6_address(ctx,storage);
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyplg_type_store_ipv6_address(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *value_str = value;
    struct lysc_type_str *type_str = (struct lysc_type_str *)type;
    struct lyd_value_ipv6_address *val;
    size_t i;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len < 16) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv6-address value size %zu "
                    "(expected at least 16).", value_len);
            goto cleanup;
        }
        for (i = 16; i < value_len; ++i) {
            if (!isalnum(value_str[i])) {
                ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv6-address zone character 0x%x.",
                        value_str[i]);
                goto cleanup;
            }
        }

        /* store IP address */
        memcpy(&val->addr, value, sizeof val->addr);

        /* store zone, if any */
        if (value_len > 16) {
            ret = lydict_insert(ctx, value_str + 16, value_len - 16, &val->zone);
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            val->zone = NULL;
        }

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(options & LYPLG_TYPE_STORE_ONLY)) {
        /* length restriction of the string */
        if (type_str->length) {
            /* value_len is in bytes, but we need number of characters here */
            ret = lyplg_type_validate_range(LY_TYPE_STRING, type_str->length, ly_utf8len(value, value_len), value, value_len, err);
            LY_CHECK_GOTO(ret, cleanup);
        }

        /* pattern restrictions */
        ret = lyplg_type_validate_patterns(type_str->patterns, value, value_len, err);
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* get the network-byte order address */
    ret = ipv6address_str2ip(value, value_len, options, ctx, &val->addr, &val->zone, err);
    LY_CHECK_GOTO(ret, cleanup);

    if (format == LY_VALUE_CANON) {
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_ipv6_address(ctx, storage);
    }
    return ret;
}